

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O0

void BrotliCompressFragmentTwoPassImpl14
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  int iVar1;
  uint8_t *__s1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  bool bVar10;
  uint32_t *local_888;
  uint32_t *local_880;
  uint8_t *literal_buf_local;
  uint32_t *command_buf_local;
  int is_last_local;
  size_t input_size_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  size_t num_commands;
  size_t num_literals;
  uint8_t *literals;
  uint32_t *commands;
  size_t block_size;
  uint8_t *base_ip;
  ulong *local_810;
  long local_808;
  int *local_800;
  uint8_t *local_7f8;
  uint32_t *local_7f0;
  int local_7e4;
  uint32_t *local_7e0;
  uint8_t *local_7d8;
  MemoryManager *local_7d0;
  undefined8 local_7c8;
  uint32_t *local_7c0;
  uint local_7b4;
  undefined4 local_7b0;
  uint32_t insert_1;
  uint32_t cur_hash_1;
  uint32_t prev_hash_1;
  uint64_t input_bytes_1;
  size_t matched_2;
  uint8_t *base_1;
  uint32_t cur_hash;
  uint32_t prev_hash;
  uint64_t input_bytes;
  int insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t kMinMatchLen;
  size_t kInputMarginBytes;
  uint8_t *puStack_720;
  int last_distance;
  uint8_t *next_emit;
  uint8_t *ip_end;
  size_t shift;
  uint8_t *ip;
  size_t *local_6f8;
  long local_6f0;
  int *local_6e8;
  int *local_6e0;
  uint32_t *local_6d8;
  uint32_t *local_6d0;
  uint8_t *local_6c8;
  uint32_t *local_6c0;
  uint32_t *local_6b8;
  ulong local_6b0;
  uint64_t v;
  uint8_t *p;
  size_t *local_698;
  undefined8 local_690;
  undefined8 local_688;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  ulong local_620;
  uint64_t h_15;
  long *local_610;
  ulong local_608;
  uint64_t h_2;
  long *local_5f8;
  ulong local_5f0;
  uint64_t h_1;
  uint8_t *local_5e0;
  ulong local_5d8;
  uint64_t h;
  long *local_5c8;
  int *local_5c0;
  size_t local_5b8;
  int *local_5b0;
  uint8_t *local_5a8;
  int *local_5a0;
  uint8_t *local_598;
  ulong local_590;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_3;
  ulong *local_568;
  long local_560;
  size_t local_558;
  ulong local_550;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched_1;
  ulong *local_528;
  long local_520;
  size_t local_518;
  int local_510;
  int local_50c;
  uint32_t extra_4;
  uint32_t extra_3;
  uint32_t extra_2;
  uint32_t extra_1;
  uint32_t code;
  uint32_t nbits_1;
  uint32_t tail_1;
  uint32_t extra;
  uint32_t inscode;
  uint32_t prefix;
  uint32_t nbits;
  uint32_t tail;
  uint local_4d4;
  ulong local_4d0;
  ulong local_4c8;
  int local_4c0;
  int local_4bc;
  uint32_t extra_18;
  uint32_t extra_17;
  uint32_t extra_16;
  uint32_t extra_15;
  uint32_t code_6;
  uint32_t nbits_9;
  uint32_t tail_8;
  uint32_t extra_14;
  uint32_t inscode_1;
  uint32_t prefix_5;
  uint32_t nbits_8;
  uint32_t tail_7;
  uint local_484;
  ulong local_480;
  ulong local_478;
  int local_470;
  uint local_46c;
  uint32_t extra_13;
  uint32_t distcode_1;
  uint32_t offset_1;
  uint32_t prefix_4;
  uint32_t nbits_7;
  uint32_t d_1;
  int local_44c;
  ulong local_448;
  int local_440;
  uint local_43c;
  uint32_t extra_5;
  uint32_t distcode;
  uint32_t offset;
  uint32_t prefix_1;
  uint32_t nbits_2;
  uint32_t d;
  int local_41c;
  ulong local_418;
  long local_410;
  size_t extra_9;
  size_t extra_8;
  size_t code_3;
  size_t nbits_4;
  size_t tail_4;
  size_t extra_7;
  size_t code_2;
  size_t tail_3;
  size_t extra_6;
  size_t code_1;
  size_t prefix_2;
  size_t nbits_3;
  size_t tail_2;
  ulong local_3a0;
  size_t local_398;
  ulong local_390;
  ulong local_388;
  uint64_t t_10;
  ulong local_378;
  uint64_t t_9;
  ulong local_368;
  uint64_t t_8;
  ulong local_358;
  uint64_t t_7;
  ulong local_348;
  uint64_t t_18;
  ulong local_338;
  uint64_t t_17;
  ulong local_328;
  uint64_t t_16;
  ulong local_318;
  uint64_t t_15;
  long local_308;
  uint64_t t;
  long local_2f8;
  uint64_t t_1;
  long local_2e8;
  uint64_t t_2;
  long local_2d8;
  uint64_t t_21;
  ulong local_2c8;
  uint64_t t_20;
  ulong local_2b8;
  uint64_t t_19;
  ulong local_2a8;
  uint64_t t_12;
  ulong local_298;
  uint64_t t_11;
  ulong local_288;
  uint64_t h_14;
  undefined4 local_274;
  ulong local_270;
  ulong local_268;
  uint64_t h_13;
  undefined4 local_254;
  ulong local_250;
  ulong local_248;
  uint64_t h_12;
  undefined4 local_234;
  ulong local_230;
  ulong local_228;
  uint64_t h_11;
  undefined4 local_214;
  ulong local_210;
  ulong local_208;
  uint64_t h_10;
  undefined4 local_1f4;
  ulong local_1f0;
  ulong local_1e8;
  uint64_t h_9;
  undefined4 local_1d4;
  ulong local_1d0;
  ulong local_1c8;
  uint64_t h_8;
  undefined4 local_1b4;
  ulong local_1b0;
  ulong local_1a8;
  uint64_t h_7;
  undefined4 local_194;
  ulong local_190;
  ulong local_188;
  uint64_t h_6;
  undefined4 local_174;
  ulong local_170;
  ulong local_168;
  uint64_t h_5;
  undefined4 local_154;
  ulong local_150;
  ulong local_148;
  uint64_t h_4;
  undefined4 local_134;
  ulong local_130;
  ulong local_128;
  uint64_t h_3;
  undefined4 local_114;
  ulong local_110;
  long local_108;
  size_t extra_12;
  size_t extra_11;
  size_t code_5;
  size_t nbits_6;
  size_t tail_6;
  size_t extra_10;
  size_t code_4;
  size_t prefix_3;
  size_t nbits_5;
  size_t tail_5;
  uint64_t local_b0;
  size_t local_a8;
  ulong local_a0;
  int local_94;
  int *piStack_90;
  uint32_t t_4;
  int local_84;
  uint8_t *puStack_80;
  uint32_t t_3;
  int local_74;
  int *piStack_70;
  uint32_t t_6;
  int local_64;
  uint8_t *puStack_60;
  uint32_t t_5;
  int local_54;
  int *piStack_50;
  uint32_t t_14;
  int local_44;
  size_t sStack_40;
  uint32_t t_13;
  ulong local_18;
  ulong *local_10;
  
  local_800 = table;
  local_808 = 0xe;
  local_810 = storage_ix;
  base_ip = storage;
  block_size = (size_t)input;
  local_7f8 = literal_buf;
  local_7f0 = command_buf;
  local_7e4 = is_last;
  local_7e0 = (uint32_t *)input_size;
  local_7d8 = input;
  local_7d0 = m;
  while( true ) {
    if (local_7e0 == (uint32_t *)0x0) {
      if (local_7e4 != 0) {
        *(ulong *)(base_ip + (*local_810 >> 3)) =
             1L << ((byte)*local_810 & 7) | (ulong)(byte)*(ulong *)(base_ip + (*local_810 >> 3));
        *local_810 = *local_810 + 1;
        *(ulong *)(base_ip + (*local_810 >> 3)) =
             1L << ((byte)*local_810 & 7) | (ulong)(byte)*(ulong *)(base_ip + (*local_810 >> 3));
        *local_810 = *local_810 + 1;
        *local_810 = *local_810 + 7 & 0xfffffff8;
      }
      return;
    }
    local_7c0 = local_7e0;
    local_7c8 = 0x20000;
    if (local_7e0 < (uint32_t *)0x20000) {
      local_880 = local_7e0;
    }
    else {
      local_880 = (uint32_t *)0x20000;
    }
    commands = local_880;
    literals = (uint8_t *)local_7f0;
    num_literals = (size_t)local_7f8;
    local_6c8 = local_7d8;
    local_6d0 = local_880;
    local_6d8 = local_7e0;
    local_6e0 = (int *)block_size;
    local_6e8 = local_800;
    local_6f0 = local_808;
    local_6f8 = &num_literals;
    ip = (uint8_t *)&literals;
    shift = (size_t)local_7d8;
    ip_end = (uint8_t *)(0x40 - local_808);
    next_emit = local_7d8 + (long)local_880;
    puStack_720 = local_7d8;
    kInputMarginBytes._4_4_ = -1;
    kMinMatchLen = 0x10;
    len_limit = 6;
    plVar3 = (long *)candidate;
    if ((uint32_t *)0xf < local_880) break;
LAB_00177768:
    candidate = (uint8_t *)plVar3;
    if (next_emit < puStack_720) {
      __assert_fail("next_emit <= ip_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x19f,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
    if (puStack_720 < next_emit) {
      local_7b4 = (int)next_emit - (int)puStack_720;
      _nbits_8 = ip;
      if (local_7b4 < 6) {
        **(uint **)ip = local_7b4;
      }
      else if (local_7b4 < 0x82) {
        prefix_5 = local_7b4 - 2;
        local_478 = (ulong)prefix_5;
        iVar2 = 0x1f;
        if (prefix_5 != 0) {
          for (; prefix_5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        inscode_1 = iVar2 - 1;
        extra_14 = prefix_5 >> ((byte)inscode_1 & 0x1f);
        tail_8 = inscode_1 * 2 + extra_14 + 2;
        nbits_9 = prefix_5 - (extra_14 << ((byte)inscode_1 & 0x1f));
        **(uint **)ip = tail_8 | nbits_9 * 0x100;
      }
      else if (local_7b4 < 0x842) {
        code_6 = local_7b4 - 0x42;
        local_480 = (ulong)code_6;
        extra_15 = 0x1f;
        if (code_6 != 0) {
          for (; code_6 >> extra_15 == 0; extra_15 = extra_15 - 1) {
          }
        }
        extra_16 = extra_15 + 10;
        extra_17 = code_6 - (1 << ((byte)extra_15 & 0x1f));
        **(uint **)ip = extra_16 | extra_17 * 0x100;
      }
      else if (local_7b4 < 0x1842) {
        extra_18 = local_7b4 - 0x842;
        **(uint **)ip = extra_18 * 0x100 | 0x15;
      }
      else if (local_7b4 < 0x5842) {
        local_4bc = local_7b4 - 0x1842;
        **(uint **)ip = local_4bc * 0x100 | 0x16;
      }
      else {
        local_4c0 = local_7b4 - 0x5842;
        **(uint **)ip = local_4c0 * 0x100 | 0x17;
      }
      local_484 = local_7b4;
      *(long *)ip = *(long *)ip + 4;
      memcpy((void *)*local_6f8,puStack_720,(ulong)local_7b4);
      *local_6f8 = *local_6f8 + (ulong)local_7b4;
    }
    sVar6 = num_literals - (long)local_7f8;
    iVar2 = ShouldCompress(local_7d8,(size_t)commands,sVar6);
    if (iVar2 == 0) {
      BrotliStoreMetaBlockHeader((size_t)commands,1,local_810,base_ip);
      *local_810 = *local_810 + 7 & 0xfffffff8;
      memcpy(base_ip + (*local_810 >> 3),local_7d8,(size_t)commands);
      *local_810 = (long)commands * 8 + *local_810;
      base_ip[*local_810 >> 3] = '\0';
    }
    else {
      lVar7 = (long)literals - (long)local_7f0;
      BrotliStoreMetaBlockHeader((size_t)commands,0,local_810,base_ip);
      local_688 = 0xd;
      local_690 = 0;
      local_698 = local_810;
      p = base_ip;
      v = (uint64_t)(base_ip + (*local_810 >> 3));
      local_6b0 = 0L << ((byte)*local_810 & 7) | (ulong)(byte)*(ulong *)v;
      *(ulong *)v = local_6b0;
      *local_810 = *local_810 + 0xd;
      local_18 = local_6b0;
      local_10 = (ulong *)v;
      StoreCommands(local_7d0,local_7f8,sVar6,local_7f0,lVar7 >> 2,local_810,base_ip);
    }
    local_7d8 = (uint8_t *)((long)commands + (long)local_7d8);
    local_7e0 = (uint32_t *)((long)local_7e0 - (long)commands);
  }
  local_6b8 = (uint32_t *)((long)local_880 - 6);
  local_6c0 = local_7e0 + -4;
  local_888 = local_6c0;
  if (local_6b8 < local_6c0) {
    local_888 = local_6b8;
  }
  ip_limit = (uint8_t *)local_888;
  _skip = (long *)(local_7d8 + (long)local_888);
  local_5c8 = (long *)(local_7d8 + 1);
  local_308 = *local_5c8;
  local_5d8 = local_308 * 0x1e35a7bd0000;
  next_ip._4_4_ = (uint)(local_5d8 >> ((byte)ip_end & 0x3f));
  shift = (size_t)local_5c8;
  h = (uint64_t)ip_end;
  t = (uint64_t)local_5c8;
  do {
    next_ip._0_4_ = 0x20;
    candidate = (uint8_t *)shift;
    plVar3 = (long *)candidate;
    if (shift <= puStack_720) {
      __assert_fail("next_emit < ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x11d,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
LAB_0017573b:
    do {
      candidate = (uint8_t *)plVar3;
      __s1 = candidate;
      base._4_4_ = next_ip._4_4_;
      uVar9 = (uint)next_ip + 1;
      base._0_4_ = (uint)next_ip >> 5;
      shift = (size_t)candidate;
      local_5e0 = candidate;
      h_1 = (uint64_t)ip_end;
      t_1 = (uint64_t)candidate;
      local_2f8 = *(long *)candidate;
      local_5f0 = local_2f8 * 0x1e35a7bd0000;
      next_ip._0_4_ = uVar9;
      if (next_ip._4_4_ != (uint)(local_5f0 >> ((byte)ip_end & 0x3f))) {
        __assert_fail("hash == Hash(ip, shift)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x123,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      plVar3 = (long *)(candidate + (uint)base);
      if (_skip < plVar3) goto LAB_00177768;
      h_2 = (uint64_t)ip_end;
      local_2e8 = *plVar3;
      local_608 = local_2e8 * 0x1e35a7bd0000;
      uVar9 = (uint)(local_608 >> ((byte)ip_end & 0x3f));
      local_5a0 = (int *)(candidate + -(long)kInputMarginBytes._4_4_);
      local_598 = candidate;
      puStack_80 = candidate;
      local_84 = *(int *)candidate;
      local_94 = *local_5a0;
      bVar10 = false;
      if ((local_84 == local_94) && (bVar10 = false, candidate[4] == (uint8_t)local_5a0[1])) {
        bVar10 = candidate[5] == *(uint8_t *)((long)local_5a0 + 5);
      }
      iVar2 = (int)candidate;
      local_5f8 = plVar3;
      t_2 = (uint64_t)plVar3;
      piStack_90 = local_5a0;
      if ((bVar10) && (local_5a0 < candidate)) {
        local_6e8[next_ip._4_4_] = iVar2 - (int)local_6e0;
        _bytes_between_hash_lookups = local_5a0;
      }
      else {
        _bytes_between_hash_lookups = (int *)((long)local_6e0 + (long)local_6e8[next_ip._4_4_]);
        if (_bytes_between_hash_lookups < local_6e0) {
          candidate = (uint8_t *)plVar3;
          next_ip._4_4_ = uVar9;
          __assert_fail("candidate >= base_ip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                        ,0x131,
                        "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                       );
        }
        if (candidate <= _bytes_between_hash_lookups) {
          candidate = (uint8_t *)plVar3;
          next_ip._4_4_ = uVar9;
          __assert_fail("candidate < ip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                        ,0x132,
                        "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                       );
        }
        local_6e8[next_ip._4_4_] = iVar2 - (int)local_6e0;
        local_5a8 = candidate;
        puStack_60 = candidate;
        local_64 = *(int *)candidate;
        local_74 = *_bytes_between_hash_lookups;
        bVar10 = false;
        if ((local_64 == local_74) &&
           (bVar10 = false, candidate[4] == (uint8_t)_bytes_between_hash_lookups[1])) {
          bVar10 = candidate[5] == *(uint8_t *)((long)_bytes_between_hash_lookups + 5);
        }
        next_ip._4_4_ = uVar9;
        local_5b0 = _bytes_between_hash_lookups;
        piStack_70 = _bytes_between_hash_lookups;
        if (!bVar10) goto LAB_0017573b;
      }
      next_ip._4_4_ = uVar9;
    } while (0x3fff0 < (long)candidate - (long)_bytes_between_hash_lookups);
    matched = (size_t)candidate;
    local_520 = (long)_bytes_between_hash_lookups + 6;
    local_528 = (ulong *)(candidate + 6);
    matched_1 = (size_t)(next_emit + (-6 - (long)candidate));
    limit2 = 0;
    x = (matched_1 >> 3) + 1;
LAB_00175ba8:
    x = x - 1;
    if (x != 0) {
      t_7 = (uint64_t)local_528;
      local_358 = *local_528;
      t_8 = local_520 + limit2;
      local_368 = *(ulong *)t_8;
      if (local_358 == local_368) break;
      t_9 = (uint64_t)local_528;
      local_378 = *local_528;
      t_10 = local_520 + limit2;
      local_388 = *(ulong *)t_10;
      iVar1 = 0;
      matching_bits = local_378 ^ local_388;
      for (uVar4 = matching_bits; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      local_550 = (ulong)iVar1;
      local_518 = (local_550 >> 3) + limit2;
      goto LAB_00175d83;
    }
    matched_1 = (matched_1 & 7) + 1;
    while (matched_1 = matched_1 - 1, matched_1 != 0) {
      if (*(char *)(local_520 + limit2) != (char)*local_528) {
        local_518 = limit2;
        goto LAB_00175d83;
      }
      local_528 = (ulong *)((long)local_528 + 1);
      limit2 = limit2 + 1;
    }
    local_518 = limit2;
LAB_00175d83:
    _insert = local_518 + 6;
    input_bytes._4_4_ = iVar2 - (int)_bytes_between_hash_lookups;
    input_bytes._0_4_ = iVar2 - (int)puStack_720;
    shift = (size_t)(candidate + _insert);
    candidate = (uint8_t *)plVar3;
    limit2 = local_518;
    iVar2 = memcmp(__s1,_bytes_between_hash_lookups,_insert);
    if (iVar2 != 0) {
      __assert_fail("0 == memcmp(base, candidate, matched)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x149,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
    local_4d4 = (uint)input_bytes;
    _nbits = ip;
    if ((uint)input_bytes < 6) {
      **(uint **)ip = (uint)input_bytes;
    }
    else if ((uint)input_bytes < 0x82) {
      prefix = (uint)input_bytes - 2;
      local_4c8 = (ulong)prefix;
      iVar2 = 0x1f;
      if (prefix != 0) {
        for (; prefix >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      inscode = iVar2 - 1;
      extra = prefix >> ((byte)inscode & 0x1f);
      tail_1 = inscode * 2 + extra + 2;
      nbits_1 = prefix - (extra << ((byte)inscode & 0x1f));
      **(uint **)ip = tail_1 | nbits_1 * 0x100;
    }
    else if ((uint)input_bytes < 0x842) {
      code = (uint)input_bytes - 0x42;
      local_4d0 = (ulong)code;
      extra_1 = 0x1f;
      if (code != 0) {
        for (; code >> extra_1 == 0; extra_1 = extra_1 - 1) {
        }
      }
      extra_2 = extra_1 + 10;
      extra_3 = code - (1 << ((byte)extra_1 & 0x1f));
      **(uint **)ip = extra_2 | extra_3 * 0x100;
    }
    else if ((uint)input_bytes < 0x1842) {
      extra_4 = (uint)input_bytes - 0x842;
      **(uint **)ip = extra_4 * 0x100 | 0x15;
    }
    else if ((uint)input_bytes < 0x5842) {
      local_50c = (uint)input_bytes - 0x1842;
      **(uint **)ip = local_50c * 0x100 | 0x16;
    }
    else {
      local_510 = (uint)input_bytes - 0x5842;
      **(uint **)ip = local_510 * 0x100 | 0x17;
    }
    *(long *)ip = *(long *)ip + 4;
    memcpy((void *)*local_6f8,puStack_720,(long)(int)(uint)input_bytes);
    *local_6f8 = *local_6f8 + (long)(int)(uint)input_bytes;
    if (input_bytes._4_4_ == kInputMarginBytes._4_4_) {
      **(undefined4 **)ip = 0x40;
      *(long *)ip = *(long *)ip + 4;
    }
    else {
      local_41c = input_bytes._4_4_;
      _nbits_2 = ip;
      prefix_1 = input_bytes._4_4_ + 3;
      local_418 = (ulong)prefix_1;
      iVar2 = 0x1f;
      if (prefix_1 != 0) {
        for (; prefix_1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      offset = iVar2 - 1;
      distcode = prefix_1 >> ((byte)offset & 0x1f) & 1;
      extra_5 = distcode + 2 << ((byte)offset & 0x1f);
      local_43c = (iVar2 + -2) * 2 + distcode + 0x50;
      local_440 = prefix_1 - extra_5;
      **(uint **)ip = local_43c | local_440 * 0x100;
      *(long *)ip = *(long *)ip + 4;
      kInputMarginBytes._4_4_ = input_bytes._4_4_;
    }
    local_3a0 = _insert;
    tail_2 = (size_t)ip;
    if (_insert < 0xc) {
      **(int **)ip = (int)_insert + 0x14;
      *(long *)ip = *(long *)ip + 4;
    }
    else if (_insert < 0x48) {
      nbits_3 = _insert - 8;
      iVar2 = 0x1f;
      if ((uint)nbits_3 != 0) {
        for (; (uint)nbits_3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      prefix_2 = (size_t)(iVar2 - 1U);
      bVar8 = (byte)(iVar2 - 1U);
      code_1 = nbits_3 >> (bVar8 & 0x3f);
      extra_6 = prefix_2 * 2 + code_1 + 0x1c;
      tail_3 = nbits_3 - (code_1 << (bVar8 & 0x3f));
      **(uint **)ip = (uint)extra_6 | (int)tail_3 * 0x100;
      local_390 = nbits_3;
      *(long *)ip = *(long *)ip + 4;
    }
    else if (_insert < 0x88) {
      code_2 = _insert - 8;
      extra_7 = (code_2 >> 5) + 0x36;
      tail_4 = code_2 & 0x1f;
      **(uint **)ip = (uint)extra_7 | (uint)(tail_4 << 8);
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    else if (_insert < 0x848) {
      nbits_4 = _insert - 0x48;
      uVar9 = 0x1f;
      if ((uint)nbits_4 != 0) {
        for (; (uint)nbits_4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      code_3 = (size_t)uVar9;
      extra_8 = code_3 + 0x34;
      extra_9 = nbits_4 - (1L << ((byte)uVar9 & 0x3f));
      **(uint **)ip = (uint)extra_8 | (int)extra_9 * 0x100;
      local_398 = nbits_4;
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    else {
      local_410 = _insert - 0x848;
      **(uint **)ip = (int)local_410 * 0x100 | 0x3f;
      *(long *)ip = *(long *)ip + 4;
      **(undefined4 **)tail_2 = 0x40;
      *(long *)tail_2 = *(long *)tail_2 + 4;
    }
    puStack_720 = (uint8_t *)shift;
    plVar3 = (long *)candidate;
    if (_skip <= shift) goto LAB_00177768;
    t_11 = shift - 5;
    local_298 = *(ulong *)t_11;
    local_114 = 0;
    h_3 = (uint64_t)ip_end;
    local_128 = local_298 * 0x1e35a7bd0000;
    bVar8 = (byte)ip_end;
    iVar1 = (int)local_6e0;
    iVar2 = (int)shift;
    local_6e8[local_128 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -5;
    local_134 = 1;
    h_4 = (uint64_t)ip_end;
    local_148 = (local_298 >> 8) * 0x1e35a7bd0000;
    local_6e8[local_148 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -4;
    local_154 = 2;
    h_5 = (uint64_t)ip_end;
    local_168 = (local_298 >> 0x10) * 0x1e35a7bd0000;
    local_6e8[local_168 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -3;
    t_12 = shift - 2;
    _cur_hash = *(ulong *)t_12;
    local_174 = 2;
    h_6 = (uint64_t)ip_end;
    local_188 = (_cur_hash >> 0x10) * 0x1e35a7bd0000;
    uVar4 = local_188 >> (bVar8 & 0x3f);
    base_1._0_4_ = (undefined4)uVar4;
    local_194 = 0;
    h_7 = (uint64_t)ip_end;
    local_1a8 = _cur_hash * 0x1e35a7bd0000;
    local_6e8[local_1a8 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -2;
    local_1b4 = 1;
    h_8 = (uint64_t)ip_end;
    local_1c8 = (_cur_hash >> 8) * 0x1e35a7bd0000;
    uVar5 = local_1c8 >> (bVar8 & 0x3f);
    base_1._4_4_ = (undefined4)uVar5;
    local_6e8[uVar5 & 0xffffffff] = (iVar2 - iVar1) + -1;
    _bytes_between_hash_lookups = (int *)((long)local_6e0 + (long)local_6e8[uVar4 & 0xffffffff]);
    local_6e8[uVar4 & 0xffffffff] = iVar2 - iVar1;
    local_2a8 = _cur_hash;
    local_1b0 = _cur_hash;
    local_190 = _cur_hash;
    local_170 = _cur_hash;
    local_150 = local_298;
    local_130 = local_298;
    local_110 = local_298;
    while( true ) {
      sVar6 = shift;
      bVar10 = false;
      if ((long)(shift - (long)_bytes_between_hash_lookups) < 0x3fff1) {
        local_5b8 = shift;
        local_5c0 = _bytes_between_hash_lookups;
        sStack_40 = shift;
        local_44 = *(int *)shift;
        piStack_50 = _bytes_between_hash_lookups;
        local_54 = *_bytes_between_hash_lookups;
        bVar10 = false;
        if ((local_44 == local_54) &&
           (bVar10 = false, *(char *)(shift + 4) == (char)_bytes_between_hash_lookups[1])) {
          bVar10 = *(char *)(shift + 5) == *(char *)((long)_bytes_between_hash_lookups + 5);
        }
      }
      puStack_720 = (uint8_t *)shift;
      if (!bVar10) break;
      matched_2 = shift;
      local_560 = (long)_bytes_between_hash_lookups + 6;
      local_568 = (ulong *)(shift + 6);
      matched_3 = (size_t)(next_emit + (-6 - shift));
      limit2_1 = 0;
      x_1 = (matched_3 >> 3) + 1;
LAB_00176bdd:
      x_1 = x_1 - 1;
      if (x_1 != 0) {
        t_15 = (uint64_t)local_568;
        local_318 = *local_568;
        t_16 = local_560 + limit2_1;
        local_328 = *(ulong *)t_16;
        if (local_318 == local_328) goto LAB_00176c5b;
        t_17 = (uint64_t)local_568;
        local_338 = *local_568;
        t_18 = local_560 + limit2_1;
        local_348 = *(ulong *)t_18;
        iVar2 = 0;
        matching_bits_1 = local_338 ^ local_348;
        for (uVar4 = matching_bits_1; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        local_590 = (ulong)iVar2;
        local_558 = (local_590 >> 3) + limit2_1;
        goto LAB_00176db8;
      }
      matched_3 = (matched_3 & 7) + 1;
      while (matched_3 = matched_3 - 1, matched_3 != 0) {
        if (*(char *)(local_560 + limit2_1) != (char)*local_568) {
          local_558 = limit2_1;
          goto LAB_00176db8;
        }
        local_568 = (ulong *)((long)local_568 + 1);
        limit2_1 = limit2_1 + 1;
      }
      local_558 = limit2_1;
LAB_00176db8:
      input_bytes_1 = local_558 + 6;
      kInputMarginBytes._4_4_ = (int)shift - (int)_bytes_between_hash_lookups;
      shift = input_bytes_1 + shift;
      limit2_1 = local_558;
      iVar2 = memcmp((void *)sVar6,_bytes_between_hash_lookups,input_bytes_1);
      if (iVar2 != 0) {
        __assert_fail("0 == memcmp(base, candidate, matched)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x17a,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      local_b0 = input_bytes_1;
      tail_5 = (size_t)ip;
      if (input_bytes_1 < 10) {
        **(int **)ip = (int)input_bytes_1 + 0x26;
      }
      else if (input_bytes_1 < 0x86) {
        nbits_5 = input_bytes_1 - 6;
        iVar2 = 0x1f;
        if ((uint)nbits_5 != 0) {
          for (; (uint)nbits_5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        prefix_3 = (size_t)(iVar2 - 1U);
        bVar8 = (byte)(iVar2 - 1U);
        code_4 = nbits_5 >> (bVar8 & 0x3f);
        extra_10 = prefix_3 * 2 + code_4 + 0x2c;
        tail_6 = nbits_5 - (code_4 << (bVar8 & 0x3f));
        **(uint **)ip = (uint)extra_10 | (int)tail_6 * 0x100;
        local_a0 = nbits_5;
      }
      else if (input_bytes_1 < 0x846) {
        nbits_6 = input_bytes_1 - 0x46;
        uVar9 = 0x1f;
        if ((uint)nbits_6 != 0) {
          for (; (uint)nbits_6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        code_5 = (size_t)uVar9;
        extra_11 = code_5 + 0x34;
        extra_12 = nbits_6 - (1L << ((byte)uVar9 & 0x3f));
        **(uint **)ip = (uint)extra_11 | (int)extra_12 * 0x100;
        local_a8 = nbits_6;
      }
      else {
        local_108 = input_bytes_1 - 0x846;
        **(uint **)ip = (int)local_108 * 0x100 | 0x3f;
      }
      *(long *)ip = *(long *)ip + 4;
      local_44c = kInputMarginBytes._4_4_;
      _nbits_7 = ip;
      prefix_4 = kInputMarginBytes._4_4_ + 3;
      local_448 = (ulong)prefix_4;
      iVar2 = 0x1f;
      if (prefix_4 != 0) {
        for (; prefix_4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      offset_1 = iVar2 - 1;
      distcode_1 = prefix_4 >> ((byte)offset_1 & 0x1f) & 1;
      extra_13 = distcode_1 + 2 << ((byte)offset_1 & 0x1f);
      local_46c = (iVar2 + -2) * 2 + distcode_1 + 0x50;
      local_470 = prefix_4 - extra_13;
      **(uint **)ip = local_46c | local_470 * 0x100;
      *(long *)ip = *(long *)ip + 4;
      puStack_720 = (uint8_t *)shift;
      plVar3 = (long *)candidate;
      if (_skip <= shift) goto LAB_00177768;
      t_19 = shift - 5;
      local_2b8 = *(ulong *)t_19;
      h_9 = (uint64_t)ip_end;
      local_1d4 = 0;
      local_1e8 = local_2b8 * 0x1e35a7bd0000;
      bVar8 = (byte)ip_end;
      iVar1 = (int)local_6e0;
      iVar2 = (int)shift;
      local_6e8[local_1e8 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -5;
      h_10 = (uint64_t)ip_end;
      local_1f4 = 1;
      local_208 = (local_2b8 >> 8) * 0x1e35a7bd0000;
      local_6e8[local_208 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -4;
      h_11 = (uint64_t)ip_end;
      local_214 = 2;
      local_228 = (local_2b8 >> 0x10) * 0x1e35a7bd0000;
      local_6e8[local_228 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -3;
      t_20 = shift - 2;
      _cur_hash_1 = *(ulong *)t_20;
      h_12 = (uint64_t)ip_end;
      local_234 = 2;
      local_248 = (_cur_hash_1 >> 0x10) * 0x1e35a7bd0000;
      uVar4 = local_248 >> (bVar8 & 0x3f);
      local_7b0 = (undefined4)uVar4;
      h_13 = (uint64_t)ip_end;
      local_254 = 0;
      local_268 = _cur_hash_1 * 0x1e35a7bd0000;
      local_6e8[local_268 >> (bVar8 & 0x3f) & 0xffffffff] = (iVar2 - iVar1) + -2;
      h_14 = (uint64_t)ip_end;
      local_274 = 1;
      local_288 = (_cur_hash_1 >> 8) * 0x1e35a7bd0000;
      uVar5 = local_288 >> (bVar8 & 0x3f);
      insert_1 = (uint32_t)uVar5;
      local_6e8[uVar5 & 0xffffffff] = (iVar2 - iVar1) + -1;
      _bytes_between_hash_lookups = (int *)((long)local_6e0 + (long)local_6e8[uVar4 & 0xffffffff]);
      local_6e8[uVar4 & 0xffffffff] = iVar2 - iVar1;
      local_2c8 = _cur_hash_1;
      local_270 = _cur_hash_1;
      local_250 = _cur_hash_1;
      local_230 = _cur_hash_1;
      local_210 = local_2b8;
      local_1f0 = local_2b8;
      local_1d0 = local_2b8;
    }
    local_610 = (long *)(shift + 1);
    h_15 = (uint64_t)ip_end;
    local_2d8 = *local_610;
    local_620 = local_2d8 * 0x1e35a7bd0000;
    next_ip._4_4_ = (uint)(local_620 >> ((byte)ip_end & 0x3f));
    shift = (size_t)local_610;
    t_21 = (uint64_t)local_610;
  } while( true );
  local_528 = local_528 + 1;
  limit2 = limit2 + 8;
  goto LAB_00175ba8;
LAB_00176c5b:
  local_568 = local_568 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00176bdd;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}